

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectromagneticEmissionsPdu.cpp
# Opt level: O3

int __thiscall
DIS::ElectromagneticEmissionsPdu::getMarshalledSize(ElectromagneticEmissionsPdu *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer pEVar4;
  ulong uVar5;
  long lVar6;
  ElectromagneticEmissionSystemData listElement;
  ElectromagneticEmissionSystemData local_80;
  
  iVar1 = DistributedEmissionsFamilyPdu::getMarshalledSize
                    (&this->super_DistributedEmissionsFamilyPdu);
  iVar2 = EntityID::getMarshalledSize(&this->_emittingEntityID);
  iVar3 = EventIdentifier::getMarshalledSize(&this->_eventID);
  iVar1 = iVar3 + iVar2 + iVar1 + 4;
  pEVar4 = (this->_systems).
           super__Vector_base<DIS::ElectromagneticEmissionSystemData,_std::allocator<DIS::ElectromagneticEmissionSystemData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_systems).
      super__Vector_base<DIS::ElectromagneticEmissionSystemData,_std::allocator<DIS::ElectromagneticEmissionSystemData>_>
      ._M_impl.super__Vector_impl_data._M_finish != pEVar4) {
    lVar6 = 0x38;
    uVar5 = 0;
    do {
      local_80._vptr_ElectromagneticEmissionSystemData =
           (_func_int **)&PTR__ElectromagneticEmissionSystemData_001b43f8;
      local_80._8_4_ = *(undefined4 *)((long)pEVar4 + lVar6 + -0x30);
      local_80._emitterSystem._vptr_EmitterSystem = (_func_int **)&PTR__EmitterSystem_001b4440;
      local_80._emitterSystem._8_4_ = *(undefined4 *)((long)pEVar4 + lVar6 + -0x20);
      local_80._location._vptr_Vector3Float = (_func_int **)&PTR__Vector3Float_001b6790;
      local_80._location._z = *(float *)((long)pEVar4 + lVar6 + -8);
      local_80._location._8_8_ = *(undefined8 *)((long)pEVar4 + lVar6 + -0x10);
      std::
      vector<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
      ::vector(&local_80._beamDataRecords,
               (vector<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
                *)((long)&pEVar4->_vptr_ElectromagneticEmissionSystemData + lVar6));
      iVar2 = ElectromagneticEmissionSystemData::getMarshalledSize(&local_80);
      iVar1 = iVar1 + iVar2;
      ElectromagneticEmissionSystemData::~ElectromagneticEmissionSystemData(&local_80);
      uVar5 = uVar5 + 1;
      pEVar4 = (this->_systems).
               super__Vector_base<DIS::ElectromagneticEmissionSystemData,_std::allocator<DIS::ElectromagneticEmissionSystemData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x50;
    } while (uVar5 < (ulong)(((long)(this->_systems).
                                    super__Vector_base<DIS::ElectromagneticEmissionSystemData,_std::allocator<DIS::ElectromagneticEmissionSystemData>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar4 >> 4)
                            * -0x3333333333333333));
  }
  return iVar1;
}

Assistant:

int ElectromagneticEmissionsPdu::getMarshalledSize() const
{
    int marshalSize = 0;

    marshalSize = DistributedEmissionsFamilyPdu::getMarshalledSize();
    marshalSize = marshalSize + _emittingEntityID.getMarshalledSize();  // _emittingEntityID
    marshalSize = marshalSize + _eventID.getMarshalledSize();  // _eventID
    marshalSize = marshalSize + 1;  // _stateUpdateIndicator
    marshalSize = marshalSize + 1;  // _numberOfSystems
    marshalSize = marshalSize + 2;  // _paddingForEmissionsPdu    

    for(unsigned long long idx=0; idx < _systems.size(); idx++)
    {
        ElectromagneticEmissionSystemData listElement = _systems[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}